

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O2

void __thiscall
t_markdown_generator::generate_service(t_markdown_generator *this,t_service *tservice)

{
  string *psVar1;
  ofstream_with_content_based_conditional_update *poVar2;
  bool bVar3;
  ostream *poVar4;
  pointer pptVar5;
  pointer pptVar6;
  vector<t_field_*,_std::allocator<t_field_*>_> excepts;
  vector<t_field_*,_std::allocator<t_field_*>_> args;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string fn_name;
  
  poVar2 = &this->f_out_;
  poVar4 = std::operator<<((ostream *)poVar2,"### Service: ");
  psVar1 = &(this->super_t_generator).service_name_;
  poVar4 = std::operator<<(poVar4,(string *)psVar1);
  std::operator<<(poVar4,'\n');
  if (tservice->extends_ != (t_service *)0x0) {
    std::operator<<((ostream *)poVar2,"**extends ** _");
    print_type(this,&tservice->extends_->super_t_type);
    poVar4 = std::operator<<((ostream *)poVar2,"_");
    std::operator<<(poVar4,'\n');
  }
  print_doc(this,(t_doc *)tservice);
  std::operator<<((ostream *)poVar2,'\n');
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  for (pptVar5 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar5 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    std::__cxx11::string::string((string *)&fn_name,(string *)&(*pptVar5)->name_);
    poVar4 = std::operator<<((ostream *)poVar2,"#### Function: ");
    poVar4 = std::operator<<(poVar4,(string *)psVar1);
    poVar4 = std::operator<<(poVar4,".");
    poVar4 = std::operator<<(poVar4,(string *)&fn_name);
    std::operator<<(poVar4,'\n');
    print_doc(this,&(*pptVar5)->super_t_doc);
    poVar4 = std::operator<<((ostream *)poVar2,'\n');
    std::operator<<(poVar4,'\n');
    print_type(this,(*pptVar5)->returntype_);
    poVar4 = std::operator<<((ostream *)poVar2,'\n');
    poVar4 = std::operator<<(poVar4," _");
    poVar4 = std::operator<<(poVar4,(string *)&fn_name);
    std::operator<<(poVar4,"_(");
    std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
              (&args,&(*pptVar5)->arglist_->members_);
    bVar3 = true;
    for (pptVar6 = args.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar6 !=
        args.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
      if (!bVar3) {
        poVar4 = std::operator<<((ostream *)poVar2,",");
        std::operator<<(poVar4,'\n');
      }
      print_type(this,(*pptVar6)->type_);
      poVar4 = std::operator<<((ostream *)poVar2," ");
      std::operator<<(poVar4,(string *)&(*pptVar6)->name_);
      if ((*pptVar6)->value_ != (t_const_value *)0x0) {
        std::operator<<((ostream *)poVar2," = ");
        print_const_value(this,(*pptVar6)->type_,(*pptVar6)->value_);
      }
      bVar3 = false;
    }
    poVar4 = std::operator<<((ostream *)poVar2,")");
    std::operator<<(poVar4,'\n');
    std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
              (&excepts,&(*pptVar5)->xceptions_->members_);
    pptVar6 = excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::operator<<((ostream *)poVar2,"> throws ");
      bVar3 = true;
      for (; pptVar6 !=
             excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
        if (!bVar3) {
          std::operator<<((ostream *)poVar2,", ");
        }
        print_type(this,(*pptVar6)->type_);
        bVar3 = false;
      }
      std::operator<<((ostream *)poVar2,'\n');
    }
    print_fn_args_doc(this,*pptVar5);
    std::operator<<((ostream *)poVar2,'\n');
    std::_Vector_base<t_field_*,_std::allocator<t_field_*>_>::~_Vector_base
              (&excepts.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>);
    std::_Vector_base<t_field_*,_std::allocator<t_field_*>_>::~_Vector_base
              (&args.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>);
    std::__cxx11::string::~string((string *)&fn_name);
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  return;
}

Assistant:

void t_markdown_generator::generate_service(t_service* tservice) {
  f_out_ << "### Service: " << service_name_ << endl;

  if (tservice->get_extends()) {
    f_out_ << "**extends ** _";
    print_type(tservice->get_extends());
    f_out_ << "_" << endl;
  }

  print_doc(tservice);
  f_out_ << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator fn_iter = functions.begin();
  for (; fn_iter != functions.end(); fn_iter++) {
    string fn_name = (*fn_iter)->get_name();
    f_out_ << "#### Function: " << service_name_ << "." << fn_name << endl;
    print_doc(*fn_iter);
    f_out_ << endl << endl;
    print_type((*fn_iter)->get_returntype());
    bool first = true;
    f_out_ << endl << " _" << fn_name << "_(";
    vector<t_field*> args = (*fn_iter)->get_arglist()->get_members();
    vector<t_field*>::iterator arg_iter = args.begin();
    for (; arg_iter != args.end(); arg_iter++) {
      if (!first) {
        f_out_ << "," << endl;
      }
      first = false;
      print_type((*arg_iter)->get_type());
      f_out_ << " " << (*arg_iter)->get_name();
      if ((*arg_iter)->get_value() != nullptr) {
        f_out_ << " = ";
        print_const_value((*arg_iter)->get_type(), (*arg_iter)->get_value());
      }
    }
    f_out_ << ")" << endl;
    first = true;
    vector<t_field*> excepts = (*fn_iter)->get_xceptions()->get_members();
    vector<t_field*>::iterator ex_iter = excepts.begin();
    if (ex_iter != excepts.end()) {
      f_out_ << "> throws ";
      for (; ex_iter != excepts.end(); ex_iter++) {
        if (!first) {
          f_out_ << ", ";
        }
        first = false;
        print_type((*ex_iter)->get_type());
      }
      f_out_ << endl;
    }
    print_fn_args_doc(*fn_iter);
    f_out_ << endl;
  }
}